

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

BufferSp __thiscall vkt::SpirVAssembly::createCompositeBuffer<int>(SpirVAssembly *this,int number)

{
  Buffer<int> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator<int> local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_14;
  SpirVAssembly *pSStack_10;
  int number_local;
  
  local_14 = number;
  pSStack_10 = this;
  this_00 = (Buffer<int> *)operator_new(0x20);
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,1,&local_14,&local_31);
  Buffer<int>::Buffer(this_00,&local_30);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  std::allocator<int>::~allocator(&local_31);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp createCompositeBuffer(T number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, number)));
}